

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::modFunction(TranslateToFuzzReader *this,Function *func)

{
  undefined1 local_98 [8];
  FunctionCreationContext context;
  
  FunctionCreationContext::FunctionCreationContext((FunctionCreationContext *)local_98,this,func);
  dropToLog(this,func);
  recombine(this,func);
  mutate(this,func);
  fixAfterChanges(this,func);
  FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)local_98);
  return;
}

Assistant:

void TranslateToFuzzReader::modFunction(Function* func) {
  FunctionCreationContext context(*this, func);

  dropToLog(func);
  // TODO: if we add OOB checks after creation, then we can do it on
  //       initial contents too, and it may be nice to *not* run these
  //       passes, like we don't run them on new functions. But, we may
  //       still want to run them some of the time, at least, so that we
  //       check variations on initial testcases even at the risk of OOB.
  recombine(func);
  mutate(func);
  fixAfterChanges(func);
}